

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal
          (FileDescriptorTables *this)

{
  FieldsByNameMap *collection;
  _Hash_node_base *p_Var1;
  FieldDescriptor *field_00;
  FieldDescriptor *field;
  PointerStringPair camelcase_key;
  FieldDescriptor *local_50;
  first_type local_48;
  
  p_Var1 = (this->symbols_by_parent_)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    collection = &this->fields_by_camelcase_name_;
    do {
      field_00 = (FieldDescriptor *)p_Var1[1]._M_nxt;
      if (field_00 == (FieldDescriptor *)0x0) {
        field_00 = (FieldDescriptor *)0x0;
      }
      else if (field_00->field_0x0 != '\x02') {
        field_00 = (FieldDescriptor *)0x0;
      }
      if (field_00 != (FieldDescriptor *)0x0) {
        local_50 = field_00;
        local_48.first = FindParentForFieldsByMap(this,field_00);
        stringpiece_internal::StringPiece::StringPiece
                  (&local_48.second,
                   *(char **)(*(long *)(field_00 + 8) + (ulong)((byte)field_00[3] & 0xc) * 8));
        this = (FileDescriptorTables *)collection;
        InsertIfNotPresent<std::unordered_map<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>,google::protobuf::FieldDescriptor_const*,google::protobuf::(anonymous_namespace)::PointerStringPairHash,std::equal_to<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>>,std::allocator<std::pair<std::pair<void_const*,google::protobuf::stringpiece_internal::StringPiece>const,google::protobuf::FieldDescriptor_const*>>>>
                  (collection,&local_48,&local_50);
      }
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void FileDescriptorTables::FieldsByCamelcaseNamesLazyInitInternal() const {
  for (Symbol symbol : symbols_by_parent_) {
    const FieldDescriptor* field = symbol.field_descriptor();
    if (!field) continue;
    PointerStringPair camelcase_key(FindParentForFieldsByMap(field),
                                    field->camelcase_name().c_str());
    InsertIfNotPresent(&fields_by_camelcase_name_, camelcase_key, field);
  }
}